

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O2

int __thiscall
TPZGeoElRefPattern<pzgeom::TPZEllipse3D>::ClassId(TPZGeoElRefPattern<pzgeom::TPZEllipse3D> *this)

{
  uint uVar1;
  int iVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"TPZGeoElRefPattern",&local_39);
  uVar1 = Hash(&local_38);
  iVar2 = TPZGeoElRefLess<pzgeom::TPZEllipse3D>::ClassId
                    (&this->super_TPZGeoElRefLess<pzgeom::TPZEllipse3D>);
  std::__cxx11::string::~string((string *)&local_38);
  return iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefPattern<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefPattern") ^ TPZGeoElRefLess<TGeo>::ClassId() << 1;
}